

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O1

void __thiscall ncnn::Yolov3DetectionOutput::Yolov3DetectionOutput(Yolov3DetectionOutput *this)

{
  int *piVar1;
  void *__ptr;
  long *plVar2;
  long lVar3;
  ParamDict pd;
  ParamDict local_5c0;
  
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Yolov3DetectionOutput_00181b78;
  (this->biases).data = (void *)0x0;
  (this->biases).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->biases).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->biases).elemsize + 4) = 0;
  (this->anchors_scale).allocator = (Allocator *)0x0;
  (this->anchors_scale).dims = 0;
  (this->anchors_scale).w = 0;
  (this->anchors_scale).h = 0;
  (this->anchors_scale).c = 0;
  (this->anchors_scale).cstep = 0;
  (this->super_Layer).one_blob_only = false;
  (this->super_Layer).support_inplace = false;
  (this->biases).allocator = (Allocator *)0x0;
  (this->biases).dims = 0;
  (this->biases).w = 0;
  (this->biases).h = 0;
  (this->biases).c = 0;
  (this->biases).cstep = 0;
  (this->mask).data = (void *)0x0;
  (this->mask).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->mask).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->mask).elemsize + 4) = 0;
  (this->mask).allocator = (Allocator *)0x0;
  (this->mask).dims = 0;
  (this->mask).w = 0;
  (this->mask).h = 0;
  (this->mask).c = 0;
  (this->mask).cstep = 0;
  (this->anchors_scale).data = (void *)0x0;
  (this->anchors_scale).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->anchors_scale).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->anchors_scale).elemsize + 4) = 0;
  ParamDict::ParamDict(&local_5c0);
  ParamDict::set(&local_5c0,0,0);
  lVar3 = 0x560;
  do {
    piVar1 = *(int **)((long)&local_5c0.params[0].v.data + lVar3);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        __ptr = *(void **)((long)&local_5c0.params[0].loaded + lVar3);
        plVar2 = *(long **)((long)&local_5c0.params[0].v.packing + lVar3);
        if (plVar2 == (long *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*plVar2 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_5c0.params[0].v.data + lVar3 + 4) = 0;
    *(undefined8 *)((long)&local_5c0.params[0].v.refcount + lVar3 + 4) = 0;
    *(undefined8 *)((long)&local_5c0.params[0].loaded + lVar3) = 0;
    *(undefined8 *)((long)&local_5c0.params[0].v.data + lVar3) = 0;
    *(undefined8 *)((long)&local_5c0.params[0].v.allocator + lVar3) = 0;
    *(undefined8 *)((long)&local_5c0.params[0].v.dims + lVar3) = 0;
    *(undefined8 *)((long)&local_5c0.params[0].v.h + lVar3) = 0;
    lVar3 = lVar3 + -0x48;
  } while (lVar3 != -0x40);
  return;
}

Assistant:

Yolov3DetectionOutput::Yolov3DetectionOutput()
{
    one_blob_only = false;
    support_inplace = false;
    
    //softmax = ncnn::create_layer(ncnn::LayerType::Softmax);

    // set param
    ncnn::ParamDict pd;
    pd.set(0, 0);// axis

    //softmax->load_param(pd);
}